

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O3

factor * __thiscall merlin::factor::binaryOpIP<merlin::factor::binOpPlus>(factor *this,long B)

{
  variable_set *this_00;
  bool bVar1;
  pointer pdVar2;
  ulong uVar3;
  subindex s2;
  variable_set v;
  factor local_c0;
  variable_set local_60;
  
  this_00 = &this->v_;
  variable_set::operator+(&local_60,this_00,(variable_set *)(B + 8));
  bVar1 = variable_set::operator==(&local_60,this_00);
  if (bVar1) {
    subindex::subindex((subindex *)&local_c0,this_00,(variable_set *)(B + 8));
    pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar2) {
      uVar3 = 0;
      do {
        pdVar2[uVar3] =
             *(double *)(*(long *)(B + 0x40) + (long)local_c0._vptr_factor * 8) + pdVar2[uVar3];
        uVar3 = uVar3 + 1;
        subindex::operator++((subindex *)&local_c0);
        pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->t_).super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3))
      ;
    }
    subindex::~subindex((subindex *)&local_c0);
  }
  else {
    binaryOp<merlin::factor::binOpPlus>(&local_c0,this,B);
    operator=(this,&local_c0);
    ~factor(&local_c0);
  }
  variable_set::~variable_set(&local_60);
  return this;
}

Assistant:

factor& binaryOpIP(const factor& B,
			Function Op) {
		variable_set v = v_ + B.v_;  							// expand scope to union
		if (v != v_)
			*this = binaryOp(B, Op); // if A's scope is too small, call binary op
		else {
			subindex s2(v_, B.v_);       		// otherwise create index over B
			for (size_t i = 0; i < num_states(); ++i, ++s2)
				Op.IP(t_[i], B[s2]);	// and do the operations
		}
		return *this;
	}